

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::
_Val_comp_iter<xray_re::xr_mesh_builder::b_proxy::less2<xray_re::_vector3<float>,xray_re::_influence<unsigned_int,float>>>
::operator()(void *this,b_proxy *__val,
            __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
            __it)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  
  lVar13 = *this;
  uVar10 = (ulong)__val->index;
  uVar11 = (ulong)(__it._M_current)->index;
  fVar3 = *(float *)(lVar13 + uVar10 * 0xc);
  fVar4 = *(float *)(lVar13 + uVar11 * 0xc);
  if (fVar3 < fVar4) {
    return true;
  }
  if ((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) {
    lVar1 = lVar13 + uVar10 * 0xc;
    lVar13 = lVar13 + uVar11 * 0xc;
    fVar5 = *(float *)(lVar1 + 4);
    fVar6 = *(float *)(lVar13 + 4);
    if (fVar5 < fVar6) {
      return true;
    }
    if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
      if (fVar3 != fVar4) {
        return false;
      }
      if (NAN(fVar3) || NAN(fVar4)) {
        return false;
      }
    }
    else {
      fVar5 = *(float *)(lVar13 + 8);
      bVar14 = fVar5 != *(float *)(lVar1 + 8);
      bVar15 = *(float *)(lVar1 + 8) <= fVar5;
      if (fVar3 != fVar4 || bVar15 && bVar14) {
        return bVar15 && bVar14;
      }
    }
    if ((*(float *)(lVar1 + 4) == *(float *)(lVar13 + 4)) &&
       (!NAN(*(float *)(lVar1 + 4)) && !NAN(*(float *)(lVar13 + 4)))) {
      if ((*(float *)(lVar1 + 8) == *(float *)(lVar13 + 8)) &&
         (!NAN(*(float *)(lVar1 + 8)) && !NAN(*(float *)(lVar13 + 8)))) {
        lVar9 = *(long *)((long)this + 8);
        lVar1 = lVar9 + uVar10 * 0x24;
        uVar10 = (ulong)*(uint *)(lVar1 + 0x20);
        uVar7 = *(uint *)(lVar9 + 0x20 + uVar11 * 0x24);
        bVar14 = (ulong)uVar7 != 0;
        lVar13 = lVar1;
        if ((uVar10 != 0) && (uVar7 != 0)) {
          lVar2 = (ulong)uVar7 * 8 + -8;
          lVar9 = lVar9 + uVar11 * 0x24;
          lVar12 = 0;
          do {
            uVar7 = *(uint *)(lVar1 + lVar12);
            uVar8 = *(uint *)(lVar9 + lVar12);
            fVar3 = *(float *)(lVar1 + 4 + lVar12);
            fVar4 = *(float *)(lVar9 + 4 + lVar12);
            if (((uVar7 != uVar8) || (fVar3 != fVar4)) || (NAN(fVar3) || NAN(fVar4))) {
              return fVar3 < fVar4 && uVar7 == uVar8 || uVar7 < uVar8;
            }
            bVar14 = lVar2 != lVar12;
            lVar13 = lVar12 + 8;
          } while ((uVar10 * 8 + -8 != lVar12) &&
                  (bVar15 = lVar2 != lVar12, lVar12 = lVar13, bVar15));
          lVar13 = lVar13 + lVar1;
        }
        return (bool)(lVar13 == lVar1 + uVar10 * 8 & bVar14);
      }
    }
  }
  return false;
}

Assistant:

inline bool operator()(const b_proxy& l, const b_proxy& r) const {
		return data1[l.index] < data1[r.index] ||
				(data1[l.index] == data1[r.index] && data2[l.index] < data2[r.index]);
	}